

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O0

pin_t __thiscall lsim::SimCircuit::pin_from_pin_id(SimCircuit *this,pin_id_t pin_id)

{
  SimComponent *this_00;
  bool bVar1;
  uint32_t index;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false> local_38;
  uint32_t local_2c;
  _Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false> local_28;
  iterator found;
  pin_id_t pin_id_local;
  SimCircuit *this_local;
  
  found.super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>._M_cur
       = (_Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>)
         (_Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>)pin_id;
  local_2c = component_id_from_pin_id(pin_id);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_lsim::SimComponent_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>_>
       ::find(&this->m_components,&local_2c);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_lsim::SimComponent_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>_>
       ::end(&this->m_components);
  bVar1 = std::__detail::operator==(&local_28,&local_38);
  if (bVar1) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false,_false>
                         *)&local_28);
    this_00 = ppVar2->second;
    index = pin_index_from_pin_id
                      ((pin_id_t)
                       found.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>
                       ._M_cur);
    this_local._4_4_ = SimComponent::pin_by_index(this_00,index);
  }
  return this_local._4_4_;
}

Assistant:

pin_t SimCircuit::pin_from_pin_id(pin_id_t pin_id) {

    auto found = m_components.find(component_id_from_pin_id(pin_id));
    if (found == m_components.end()) {
        return PIN_UNDEFINED;
    }

    return found->second->pin_by_index(pin_index_from_pin_id(pin_id));
}